

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O3

void __thiscall
Indexer::Indexer(Indexer *this,DatabaseSnapshot *snap,
                vector<IndexType,_std::allocator<IndexType>_> *types)

{
  vector<IndexType,_std::allocator<IndexType>_> local_50;
  vector<IndexType,_std::allocator<IndexType>_> local_38;
  
  this->snap = snap;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&this->types,types);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&local_38,types);
  DatasetBuilder::DatasetBuilder(&this->flat_builder,FLAT,&local_38);
  if (local_38.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&local_50,types);
  DatasetBuilder::DatasetBuilder(&this->bitmap_builder,BITMAP,&local_50);
  if (local_50.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->created_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Indexer::Indexer(const DatabaseSnapshot *snap,
                 const std::vector<IndexType> &types)
    : snap(snap),
      types(types),
      flat_builder(BuilderType::FLAT, types),
      bitmap_builder(BuilderType::BITMAP, types) {}